

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xml_attribute __thiscall pugi::xml_node::append_copy(xml_node *this,xml_attribute *proto)

{
  xml_node_struct *object;
  xml_attribute_struct *pxVar1;
  xml_attribute_struct *pxVar2;
  uint uVar3;
  xml_allocator *alloc;
  xml_attribute_struct *da;
  
  if (((proto->_attr != (xml_attribute_struct *)0x0) &&
      (object = this->_root, object != (xml_node_struct *)0x0)) &&
     ((uVar3 = (uint)object->header & 0xf, uVar3 == 7 || (uVar3 == 2)))) {
    alloc = impl::anon_unknown_0::get_allocator<pugi::xml_node_struct>(object);
    da = impl::anon_unknown_0::allocate_attribute(alloc);
    if (da != (xml_attribute_struct *)0x0) {
      pxVar1 = this->_root->first_attribute;
      if (pxVar1 == (xml_attribute_struct *)0x0) {
        this->_root->first_attribute = da;
        pxVar1 = da;
      }
      else {
        pxVar2 = pxVar1->prev_attribute_c;
        pxVar2->next_attribute = da;
        da->prev_attribute_c = pxVar2;
      }
      pxVar1->prev_attribute_c = da;
      impl::anon_unknown_0::node_copy_attribute(da,proto->_attr);
      return (xml_attribute)da;
    }
  }
  return (xml_attribute)(xml_attribute_struct *)0x0;
}

Assistant:

PUGI__FN bool xml_attribute::operator!() const
	{
		return !_attr;
	}